

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O0

TestObject * __thiscall StressTester::CreateRandom(StressTester *this)

{
  long lVar1;
  TestObject *this_00;
  Recycler *recycler;
  int iVar2;
  TestObject **ptr;
  TestObject *pTVar3;
  TestObject *apTStack_60 [3];
  Recycler *local_48;
  StressTester *local_40;
  int local_34;
  int local_30;
  int j;
  int i_1;
  int i;
  TestObject **objs;
  void *memory;
  StressTester *pSStack_10;
  int numObjects;
  StressTester *this_local;
  
  apTStack_60[0] = (TestObject *)0xa02059;
  local_40 = this;
  pSStack_10 = this;
  iVar2 = PAL_rand();
  memory._4_4_ = iVar2 + 1 + (iVar2 / 5000) * -5000;
  lVar1 = -((long)memory._4_4_ * 8 + 0x2fU & 0xfffffffffffffff0);
  ptr = (TestObject **)((long)apTStack_60 + lVar1 + 8);
  objs = ptr;
  *(undefined8 *)((long)apTStack_60 + lVar1) = 0xa020b0;
  _i_1 = (undefined8 *)AlignPtr<void*>(ptr,0x20);
  for (j = 0; j < memory._4_4_; j = j + 1) {
    local_48 = local_40->recycler;
    *(undefined8 *)((long)apTStack_60 + lVar1) = 0xa020d3;
    iVar2 = PAL_rand();
    recycler = local_48;
    *(undefined8 *)((long)apTStack_60 + lVar1) = 0xa020e6;
    pTVar3 = TestObject::Create(recycler,10,(long)iVar2,NormalObj);
    _i_1[j] = pTVar3;
  }
  for (local_30 = 0; local_30 < memory._4_4_; local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
      apTStack_60[1] = (TestObject *)_i_1[local_30];
      apTStack_60[2] = (TestObject *)_i_1;
      *(undefined8 *)((long)apTStack_60 + lVar1) = 0xa02139;
      iVar2 = PAL_rand();
      this_00 = apTStack_60[1];
      pTVar3 = *(TestObject **)((long)apTStack_60[2] + (long)(iVar2 % memory._4_4_) * 8);
      *(undefined8 *)((long)apTStack_60 + lVar1) = 0xa02151;
      TestObject::SetRandom(this_00,pTVar3);
    }
  }
  return (TestObject *)*_i_1;
}

Assistant:

TestObject *StressTester::CreateRandom()
{
    int numObjects = rand() % 5000 + 1;

    void *memory = _alloca(numObjects * sizeof(TestObject*)+OBJALIGN);
    TestObject **objs = reinterpret_cast<TestObject**>(AlignPtr(memory, OBJALIGN));

    // Create the objects
    for (int i = 0; i < numObjects; ++i)
    {
        objs[i] = TestObject::Create(recycler, 10, rand());
    }

    // Create links between objects
    for (int i = 0; i < numObjects; ++i)
    {
        for (int j = 0; j < 5; ++j)
        {
            objs[i]->SetRandom(objs[rand() % numObjects]);
        }
    }

    return objs[0];
}